

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

void soul::Optimisations::removeUnusedObjects(Program *program)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Module *mainModule_00;
  Module *mainModule_01;
  bool objectsRemoved;
  Module *mainModule;
  Program *program_local;
  
  mainModule_00 = Program::getMainProcessor(program);
  do {
    mainModule_01 = Program::getMainProcessor(program);
    bVar1 = removeUnusedFunctions(program,mainModule_01,false);
    bVar2 = removeUnusedStructs(program);
    bVar3 = removeUnusedModules(program,mainModule_00);
  } while ((bVar1 || bVar2) || bVar3);
  return;
}

Assistant:

static void removeUnusedObjects (Program& program)
    {
        auto& mainModule = program.getMainProcessor();

        bool objectsRemoved = false;

        do
        {
            objectsRemoved = removeUnusedFunctions (program, program.getMainProcessor(), false);
            objectsRemoved |= removeUnusedStructs (program);
            objectsRemoved |= removeUnusedModules (program, mainModule);
        }
        while (objectsRemoved);
    }